

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjInitFromArray(jx9_vm *pVm,jx9_value *pObj,jx9_hashmap *pArray)

{
  jx9_hashmap *pArray_local;
  jx9_value *pObj_local;
  jx9_vm *pVm_local;
  
  SyZero(pObj,0x40);
  pObj->pVm = pVm;
  SyBlobInit(&pObj->sBlob,&pVm->sAllocator);
  pObj->iFlags = 0x40;
  (pObj->x).pOther = pArray;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInitFromArray(jx9_vm *pVm, jx9_value *pObj, jx9_hashmap *pArray)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	/* Set the desired type */
	pObj->iFlags = MEMOBJ_HASHMAP;
	pObj->x.pOther = pArray;
	return SXRET_OK;
}